

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertiontests.cpp
# Opt level: O0

void anon_unknown.dwarf_2fa16::assert_range_equals(void)

{
  initializer_list<long> __l;
  initializer_list<int> __l_00;
  TestFailure *anon_var_0;
  allocator<long> local_a9;
  long local_a8 [5];
  iterator local_80;
  size_type local_78;
  undefined1 local_70 [8];
  list<long,_std::allocator<long>_> li;
  allocator<int> local_41;
  int local_40 [4];
  iterator local_30;
  size_type local_28;
  undefined1 local_20 [8];
  vector<int,_std::allocator<int>_> v;
  
  local_40[0] = 0;
  local_40[1] = 1;
  local_40[2] = 2;
  local_40[3] = 3;
  local_30 = local_40;
  local_28 = 4;
  std::allocator<int>::allocator(&local_41);
  __l_00._M_len = local_28;
  __l_00._M_array = local_30;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_20,__l_00,&local_41);
  std::allocator<int>::~allocator(&local_41);
  local_a8[2] = 2;
  local_a8[3] = 3;
  local_a8[0] = 0;
  local_a8[1] = 1;
  local_80 = local_a8;
  local_78 = 4;
  std::allocator<long>::allocator(&local_a9);
  __l._M_len = local_78;
  __l._M_array = local_80;
  std::__cxx11::list<long,_std::allocator<long>_>::list
            ((list<long,_std::allocator<long>_> *)local_70,__l,&local_a9);
  std::allocator<long>::~allocator(&local_a9);
  UnitTests::Assert::Assert
            ((Assert *)&anon_var_0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/assertiontests.cpp"
             ,0x166);
  UnitTests::Assert::
  RangeEquals<std::__cxx11::list<long,std::allocator<long>>&,std::vector<int,std::allocator<int>>&>
            ((Assert *)&anon_var_0,(list<long,_std::allocator<long>_> *)local_70,
             (vector<int,_std::allocator<int>_> *)local_20);
  std::__cxx11::list<long,_std::allocator<long>_>::~list
            ((list<long,_std::allocator<long>_> *)local_70);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_20);
  return;
}

Assistant:

TEST(assert_range_equals)
    {
        try
        {
            std::vector<int> v{0, 1, 2, 3};
            std::list<long>  li{0, 1, 2, 3};
            ASSERT_RANGE_EQUALS(li, v);
        }
        catch (UnitTests::TestFailure&)
        {
            FAIL("ASSERT_RANGE_EQUALS should not have fired here.");
        }
    }